

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_cost_enc.c
# Opt level: O0

int CostModelBuild(CostModel *m,int xsize,int cache_bits,VP8LBackwardRefs *refs)

{
  VP8LHistogram *pVVar1;
  VP8LHistogram *in_RCX;
  undefined4 in_EDX;
  int in_ESI;
  _func_int_int_int *in_RDI;
  VP8LHistogram *histo;
  int ok;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar2;
  
  iVar2 = 0;
  pVVar1 = VP8LAllocateHistogram((int)((ulong)in_RCX >> 0x20));
  if (pVVar1 != (VP8LHistogram *)0x0) {
    VP8LHistogramInit((VP8LHistogram *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
                      (int)((ulong)pVVar1 >> 0x20),(int)pVVar1);
    VP8LHistogramStoreRefs
              ((VP8LBackwardRefs *)CONCAT44(histo._4_4_,histo._0_4_),in_RDI,in_ESI,in_RCX);
    VP8LHistogramNumCodes(pVVar1->palette_code_bits);
    ConvertPopulationCountTableToBitEstimates
              (histo._4_4_,(uint32_t *)in_RDI,(uint32_t *)CONCAT44(in_ESI,in_EDX));
    ConvertPopulationCountTableToBitEstimates
              (histo._4_4_,(uint32_t *)in_RDI,(uint32_t *)CONCAT44(in_ESI,in_EDX));
    ConvertPopulationCountTableToBitEstimates
              (histo._4_4_,(uint32_t *)in_RDI,(uint32_t *)CONCAT44(in_ESI,in_EDX));
    ConvertPopulationCountTableToBitEstimates
              (histo._4_4_,(uint32_t *)in_RDI,(uint32_t *)CONCAT44(in_ESI,in_EDX));
    ConvertPopulationCountTableToBitEstimates
              (histo._4_4_,(uint32_t *)in_RDI,(uint32_t *)CONCAT44(in_ESI,in_EDX));
    iVar2 = 1;
  }
  VP8LFreeHistogram((VP8LHistogram *)0x1a0de6);
  return iVar2;
}

Assistant:

static int CostModelBuild(CostModel* const m, int xsize, int cache_bits,
                          const VP8LBackwardRefs* const refs) {
  int ok = 0;
  VP8LHistogram* const histo = VP8LAllocateHistogram(cache_bits);
  if (histo == NULL) goto Error;

  // The following code is similar to VP8LHistogramCreate but converts the
  // distance to plane code.
  VP8LHistogramInit(histo, cache_bits, /*init_arrays=*/ 1);
  VP8LHistogramStoreRefs(refs, VP8LDistanceToPlaneCode, xsize, histo);

  ConvertPopulationCountTableToBitEstimates(
      VP8LHistogramNumCodes(histo->palette_code_bits), histo->literal,
      m->literal);
  ConvertPopulationCountTableToBitEstimates(
      VALUES_IN_BYTE, histo->red, m->red);
  ConvertPopulationCountTableToBitEstimates(
      VALUES_IN_BYTE, histo->blue, m->blue);
  ConvertPopulationCountTableToBitEstimates(
      VALUES_IN_BYTE, histo->alpha, m->alpha);
  ConvertPopulationCountTableToBitEstimates(
      NUM_DISTANCE_CODES, histo->distance, m->distance);
  ok = 1;

 Error:
  VP8LFreeHistogram(histo);
  return ok;
}